

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O0

t_object * xemmai::t_module::f_instantiate(wstring_view a_name)

{
  wstring_view a_path;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 a_index;
  t_engine *ptVar1;
  size_t sVar2;
  bool bVar3;
  pointer ppVar4;
  t_object *ptVar5;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar6;
  t_global *this;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar7;
  t_string *this_00;
  wstring *__str;
  t_code *this_01;
  t_library *ptVar8;
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  *in_R8;
  __sv_type __y;
  wstring_view wVar9;
  wstring_view a_path_00;
  wstring_view a_name_00;
  wstring_view a_name_01;
  bool local_271;
  allocator<wchar_t> local_261;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_260;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_240;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_220;
  __sv_type local_200;
  undefined1 local_1f0 [32];
  size_t sStack_1d0;
  __sv_type local_1c8;
  t_object *local_1b8;
  t_object *body;
  t_engine *local_198;
  size_t sStack_190;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_180;
  __sv_type local_160;
  t_object *local_150;
  t_object *code;
  size_t sStack_140;
  wstring_view local_130;
  t_path local_120;
  t_path local_100;
  undefined1 local_e0 [8];
  wstring path;
  undefined1 local_b0 [8];
  t_value<xemmai::t_pointer> x;
  size_t i_1;
  t_value<xemmai::t_pointer> n;
  t_svalue *paths;
  _Self local_58;
  _Self local_50;
  iterator i;
  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
  *instances;
  t_lock_with_safe_region<std::recursive_mutex> local_30;
  t_lock_with_safe_region<std::recursive_mutex> lock;
  t_engine *engine;
  wstring_view a_name_local;
  
  a_name_local._M_len = (size_t)a_name._M_str;
  engine = (t_engine *)a_name._M_len;
  lock.super_lock_guard<std::recursive_mutex>._M_device =
       (lock_guard<std::recursive_mutex>)f_engine();
  t_lock_with_safe_region<std::recursive_mutex>::t_lock_with_safe_region
            (&local_30,
             (recursive_mutex *)
             ((long)lock.super_lock_guard<std::recursive_mutex>._M_device + 0x410));
  std::mutex::lock((mutex *)((long)lock.super_lock_guard<std::recursive_mutex>._M_device + 0x170));
  i._M_node = (_Base_ptr)((long)lock.super_lock_guard<std::recursive_mutex>._M_device + 0x3e0);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::wstring,xemmai::t_slot,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
       ::lower_bound<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                 ((map<std::__cxx11::wstring,xemmai::t_slot,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
                   *)i._M_node,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&engine);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
       ::end(i._M_node);
  bVar3 = std::operator==(&local_50,&local_58);
  sVar2 = a_name_local._M_len;
  ptVar1 = engine;
  local_271 = false;
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>
             ::operator->(&local_50);
    __y = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)ppVar4);
    __x._M_str = (wchar_t *)sVar2;
    __x._M_len = (size_t)ptVar1;
    local_271 = std::operator==(__x,__y);
  }
  if (local_271 == false) {
    std::mutex::unlock((mutex *)((long)lock.super_lock_guard<std::recursive_mutex>._M_device + 0x170
                                ));
    ptVar5 = t_engine::f_module_system
                       ((t_engine *)lock.super_lock_guard<std::recursive_mutex>._M_device);
    aVar6 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2)t_object::f_fields(ptVar5);
    n.field_0 = aVar6;
    this = f_global();
    ptVar5 = t_global::f_symbol_size(this);
    t_value<xemmai::t_slot>::f_invoke<>
              ((t_value<xemmai::t_slot> *)&i_1,(t_object *)aVar6,(size_t *)ptVar5);
    ptVar5 = t_pointer::operator_cast_to_t_object_((t_pointer *)&i_1);
    f_check<unsigned_long>(ptVar5,L"size");
    x.field_0.v_integer = 0;
    while( true ) {
      aVar6 = x.field_0;
      aVar7.v_integer =
           f_as<unsigned_long,xemmai::t_value<xemmai::t_pointer>&>
                     ((t_value<xemmai::t_pointer> *)&i_1);
      a_index = n.field_0;
      if ((ulong)aVar7 <= (ulong)aVar6) {
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::
        wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                  ((wstring *)&local_260,
                   (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&engine,&local_261);
        std::operator+(&local_240,L"module \"",&local_260);
        std::operator+(&local_220,&local_240,L"\" not found.");
        local_200 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_220)
        ;
        wVar9._M_str = local_200._M_str;
        wVar9._M_len = (size_t)wVar9._M_str;
        f_throw((xemmai *)local_200._M_len,wVar9);
      }
      t_value<xemmai::t_pointer>::t_value<unsigned_long,_true>
                ((t_value<xemmai::t_pointer> *)((long)&path.field_2 + 8),x.field_0.v_integer);
      t_value<xemmai::t_slot>::f_get_at((t_value<xemmai::t_slot> *)local_b0,(t_pvalue *)a_index);
      ptVar5 = t_pointer::operator_cast_to_t_object_((t_pointer *)local_b0);
      f_check<xemmai::t_string>(ptVar5,L"path");
      ptVar5 = t_pointer::operator->((t_pointer *)local_b0);
      this_00 = t_object::f_as<xemmai::t_string>(ptVar5);
      wVar9 = t_string::operator_cast_to_basic_string_view(this_00);
      local_130 = wVar9;
      portable::t_path::t_path(&local_120,wVar9);
      code = (t_object *)engine;
      sStack_140 = a_name_local._M_len;
      a_path._M_str = (wchar_t *)a_name_local._M_len;
      a_path._M_len = (size_t)engine;
      portable::t_path::operator/(&local_100,&local_120,a_path);
      __str = portable::t_path::operator_cast_to_wstring_(&local_100);
      std::__cxx11::wstring::wstring((wstring *)local_e0,__str);
      portable::t_path::~t_path(&local_100);
      portable::t_path::~t_path(&local_120);
      std::operator+(&local_180,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_e0,L".xm");
      local_160 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_180);
      a_path_00._M_str = local_160._M_str;
      a_path_00._M_len = (size_t)a_path_00._M_str;
      ptVar5 = f_load_script((t_module *)local_160._M_len,a_path_00);
      std::__cxx11::wstring::~wstring((wstring *)&local_180);
      local_150 = ptVar5;
      if (ptVar5 == (t_object *)0x0) {
        local_1c8 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_e0);
        ptVar5 = f_load_library(local_1c8);
        local_1b8 = ptVar5;
        if (ptVar5 == (t_object *)0x0) {
          bVar3 = false;
        }
        else {
          local_1f0._24_8_ = engine;
          sStack_1d0 = a_name_local._M_len;
          ptVar8 = t_object::f_as<xemmai::t_library>(ptVar5);
          (*(ptVar8->super_t_body)._vptr_t_body[3])(local_1f0);
          a_name_01._M_str = (wchar_t *)ptVar5;
          a_name_01._M_len = sStack_1d0;
          a_name_local._M_str =
               (wchar_t *)f_new((t_module *)local_1f0._24_8_,a_name_01,(t_object *)local_1f0,in_R8);
          std::
          vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
          ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                     *)local_1f0);
          bVar3 = true;
        }
      }
      else {
        local_198 = engine;
        sStack_190 = a_name_local._M_len;
        this_01 = t_object::f_as<xemmai::t_code>(ptVar5);
        ptVar5 = t_slot::operator_cast_to_t_object_(&this_01->v_module);
        f_execute_script((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                          *)&body,local_150);
        a_name_00._M_str = (wchar_t *)ptVar5;
        a_name_00._M_len = sStack_190;
        a_name_local._M_str =
             (wchar_t *)f_new((t_module *)local_198,a_name_00,(t_object *)&body,in_R8);
        std::
        vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
        ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                   *)&body);
        bVar3 = true;
      }
      std::__cxx11::wstring::~wstring((wstring *)local_e0);
      if (bVar3) break;
      x.field_0.v_integer = x.field_0.v_integer + 1;
    }
  }
  else {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>
             ::operator->(&local_50);
    ptVar5 = t_slot::operator->(&ppVar4->second);
    ptVar5->v_reviving = true;
    std::mutex::unlock((mutex *)((long)lock.super_lock_guard<std::recursive_mutex>._M_device + 0x170
                                ));
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>
             ::operator->(&local_50);
    a_name_local._M_str = (wchar_t *)t_slot::operator_cast_to_t_object_(&ppVar4->second);
  }
  t_lock_with_safe_region<std::recursive_mutex>::~t_lock_with_safe_region(&local_30);
  return (t_object *)a_name_local._M_str;
}

Assistant:

t_object* t_module::f_instantiate(std::wstring_view a_name)
{
	auto engine = f_engine();
	t_lock_with_safe_region lock(engine->v_module__instantiate__mutex);
	engine->v_object__reviving__mutex.lock();
	{
		auto& instances = engine->v_module__instances;
		auto i = instances.lower_bound(a_name);
		if (i != instances.end() && i->first == a_name) {
			i->second->v_reviving = true;
			engine->v_object__reviving__mutex.unlock();
			return i->second;
		}
	}
	engine->v_object__reviving__mutex.unlock();
	auto& paths = engine->f_module_system()->f_fields()[/*path*/0];
	static size_t index;
	auto n = paths.f_invoke(f_global()->f_symbol_size(), index);
	f_check<size_t>(n, L"size");
	for (size_t i = 0; i < f_as<size_t>(n); ++i) {
		auto x = paths.f_get_at(i);
		f_check<t_string>(x, L"path");
		std::wstring path = portable::t_path(x->f_as<t_string>()) / a_name;
		if (auto code = f_load_script(path + L".xm")) return f_new(a_name, code->f_as<t_code>().v_module, f_execute_script(code));
		if (auto body = f_load_library(path)) return f_new(a_name, body, body->f_as<t_library>().f_define());
	}
	f_throw(L"module \"" + std::wstring(a_name) + L"\" not found.");
}